

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

IShaderResourceVariable * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetStaticVariableByName
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,SHADER_TYPE ShaderType,Char *Name)

{
  PipelineResourceSignatureImplType *this_00;
  IShaderResourceVariable *pIVar1;
  string _msg;
  Char *Name_local;
  Char *local_20;
  
  Name_local = Name;
  CheckPipelineReady(this);
  if (this->m_UsingImplicitSignature == false) {
    FormatString<char[173]>
              (&_msg,(char (*) [173])
                     "IPipelineState::GetStaticVariableByName is not allowed for pipelines that use explicit resource signatures. Use IPipelineResourceSignature::GetStaticVariableByName instead."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
  }
  else {
    if ((this->m_ActiveShaderStages & ShaderType) != SHADER_TYPE_UNKNOWN) {
      this_00 = GetResourceSignature(this,0);
      pIVar1 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetStaticVariableByName
                         (&this_00->
                           super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                          ShaderType,Name);
      return pIVar1;
    }
    local_20 = GetShaderTypeLiteralName(ShaderType);
    FormatString<char[33],char_const*,char[19],char_const*,char[35],char_const*,char[3]>
              (&_msg,(Diligent *)"Unable to find static variable \'",(char (*) [33])&Name_local,
               (char **)"\' in shader stage ",(char (*) [19])&local_20,
               (char **)" as the stage is inactive in PSO \'",
               (char (*) [35])
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                ).m_Desc,(char **)"\'.",(char (*) [3])_msg._M_dataplus._M_p);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
  }
  std::__cxx11::string::~string((string *)&_msg);
  return (IShaderResourceVariable *)0x0;
}

Assistant:

GetStaticVariableByName(SHADER_TYPE ShaderType,
                                                                                const Char* Name) override final
    {
        CheckPipelineReady();

        if (!m_UsingImplicitSignature)
        {
            LOG_ERROR_MESSAGE("IPipelineState::GetStaticVariableByName is not allowed for pipelines that use explicit "
                              "resource signatures. Use IPipelineResourceSignature::GetStaticVariableByName instead.");
            return nullptr;
        }

        if ((m_ActiveShaderStages & ShaderType) == 0)
        {
            LOG_WARNING_MESSAGE("Unable to find static variable '", Name, "' in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is inactive in PSO '", this->m_Desc.Name, "'.");
            return nullptr;
        }

        return this->GetResourceSignature(0)->GetStaticVariableByName(ShaderType, Name);
    }